

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::transfer_densities_and_conserve_coarsen
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Adj *keys2doms,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  LOs same_ents2old_ents_00;
  LOs same_ents2new_ents_00;
  OpConservation op_conservation;
  Cavs *pCVar1;
  bool bVar2;
  Int ent_dim;
  Int IVar3;
  LO LVar4;
  TagBase *tag;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Write<double> new_elem_densities_w;
  LOs keys2prods;
  Adj bdry_keys2doms;
  Cavs init_cavs;
  Cavs color_cavs;
  CavsByBdryStatus cavs;
  undefined4 in_stack_fffffffffffffc24;
  Alloc *in_stack_fffffffffffffc28;
  Mesh *pMVar6;
  undefined4 in_stack_fffffffffffffc40;
  undefined3 uVar7;
  allocator local_3b5;
  int local_3b4;
  Mesh *local_3b0;
  Write<double> local_3a8;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  Write<int> local_388;
  undefined1 local_378 [32];
  Write<int> local_358;
  Write<int> local_348;
  Write<int> local_338;
  Write<double> local_328;
  Write<int> local_318;
  Write<int> local_308;
  Write<int> local_2f8;
  Write<double> local_2e8;
  Write<double> local_2d8;
  Write<double> local_2c8;
  Cavs local_2b8;
  Adj local_278;
  Cavs local_248;
  Cavs local_208;
  Cavs local_1c8;
  Cavs local_188;
  Cavs *local_148;
  Cavs *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Cavs *local_98;
  
  local_3b0 = (Mesh *)opts;
  bVar2 = has_densities_or_conserved(old_mesh,opts);
  if (bVar2) {
    Write<int>::Write(&local_338,(Write<int> *)keys2doms);
    Write<int>::Write(&local_348,&keys2verts->write_);
    Write<int>::Write(&local_358,&local_338);
    Write<int>::Write(&local_2f8,&prods2new_ents->write_);
    form_initial_cavs(&local_248,old_mesh,new_mesh,0,(LOs *)&local_348,(LOs *)&local_358,
                      (LOs *)&local_2f8);
    Write<int>::~Write(&local_2f8);
    Write<int>::~Write(&local_358);
    Write<int>::~Write(&local_348);
    Adj::Adj(&local_278,keys2doms);
    Cavs::Cavs(&local_2b8,&local_248);
    Write<int>::Write((Write<int> *)(local_378 + 0x10),&keys2verts->write_);
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffeb8,old_mesh,new_mesh,&local_2b8,0,
                      (LOs *)(local_378 + 0x10),&local_278.super_Graph);
    Write<int>::~Write((Write<int> *)(local_378 + 0x10));
    Cavs::~Cavs(&local_2b8);
    ent_dim = Mesh::dim(old_mesh);
    local_3b4 = 0;
    while( true ) {
      IVar3 = Mesh::ntags(old_mesh,ent_dim);
      if (IVar3 <= local_3b4) break;
      pMVar6 = old_mesh;
      tag = Mesh::get_tag(old_mesh,ent_dim,local_3b4);
      bVar2 = should_conserve(old_mesh,(TransferOpts *)local_3b0,ent_dim,tag);
      if (bVar2) {
LAB_0026b58f:
        IVar3 = TagBase::ncomps(tag);
        LVar4 = Mesh::nelems(new_mesh);
        std::__cxx11::string::string((string *)&local_208,"",&local_3b5);
        Write<double>::Write(&local_3a8,LVar4 * IVar3,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        Cavs::Cavs(&local_188,local_148);
        Write<double>::Write(&local_2c8,&local_3a8);
        transfer_by_intersection(pMVar6,new_mesh,tag,&local_188,&local_2c8);
        Write<double>::~Write(&local_2c8);
        Cavs::~Cavs(&local_188);
        Cavs::Cavs(&local_1c8,local_100);
        Write<double>::Write(&local_2d8,&local_3a8);
        transfer_by_intersection(pMVar6,new_mesh,tag,&local_1c8,&local_2d8);
        Write<double>::~Write(&local_2d8);
        Cavs::~Cavs(&local_1c8);
        pCVar1 = local_98;
        for (_Var5._M_pi = local_a0._M_pi; (Cavs *)_Var5._M_pi != pCVar1;
            _Var5._M_pi = _Var5._M_pi + 0x40) {
          Cavs::Cavs(&local_208,(Cavs *)_Var5._M_pi);
          Cavs::Cavs((Cavs *)&stack0xffffffffffffff90,&local_208);
          Write<double>::Write(&local_2e8,&local_3a8);
          transfer_by_intersection(pMVar6,new_mesh,tag,(Cavs *)&stack0xffffffffffffff90,&local_2e8);
          Write<double>::~Write(&local_2e8);
          Cavs::~Cavs((Cavs *)&stack0xffffffffffffff90);
          Cavs::~Cavs(&local_208);
        }
        Write<int>::Write(&local_308,&same_ents2old_ents->write_);
        Write<int>::Write(&local_318,&same_ents2new_ents->write_);
        Write<double>::Write(&local_328,&local_3a8);
        transfer_common2<double>
                  (pMVar6,new_mesh,ent_dim,(LOs *)&local_308,(LOs *)&local_318,tag,&local_328);
        Write<double>::~Write(&local_328);
        Write<int>::~Write(&local_318);
        Write<int>::~Write(&local_308);
        Write<double>::~Write(&local_3a8);
      }
      else {
        bVar2 = is_density(pMVar6,(TransferOpts *)local_3b0,ent_dim,tag);
        if (bVar2) goto LAB_0026b58f;
      }
      local_3b4 = local_3b4 + 1;
      old_mesh = pMVar6;
    }
    pMVar6 = old_mesh;
    bVar2 = should_conserve_any(old_mesh,(TransferOpts *)local_3b0);
    if (bVar2) {
      Write<int>::Write((Write<int> *)local_378,&same_ents2old_ents->write_);
      Write<int>::Write(&local_388,&same_ents2new_ents->write_);
      local_398 = 0x1000101;
      uStack_394 = 0;
      uStack_390 = 0;
      same_ents2old_ents_00.write_.shared_alloc_.direct_ptr._4_4_ = in_stack_fffffffffffffc24;
      same_ents2old_ents_00.write_.shared_alloc_._0_12_ = ZEXT812(0x1000101);
      same_ents2new_ents_00.write_.shared_alloc_.direct_ptr = new_mesh;
      same_ents2new_ents_00.write_.shared_alloc_.alloc = in_stack_fffffffffffffc28;
      uVar7 = (undefined3)((uint)in_stack_fffffffffffffc40 >> 8);
      op_conservation.momentum.this_time._M_elems[2] = (bool)(char)in_stack_fffffffffffffc40;
      op_conservation.momentum.always._M_elems[0] = (bool)(char)uVar7;
      op_conservation.momentum.always._M_elems[1] = (bool)(char)((uint3)uVar7 >> 8);
      op_conservation.momentum.always._M_elems[2] = (bool)(char)((uint3)uVar7 >> 0x10);
      op_conservation._0_8_ = pMVar6;
      transfer_conservation_errors
                ((Omega_h *)old_mesh,local_3b0,(TransferOpts *)new_mesh,
                 (Mesh *)&stack0xfffffffffffffeb8,(CavsByBdryStatus *)local_378,
                 same_ents2old_ents_00,same_ents2new_ents_00,op_conservation);
      Write<int>::~Write(&local_388);
      Write<int>::~Write((Write<int> *)local_378);
    }
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
            *)&stack0xfffffffffffffeb8);
    Adj::~Adj(&local_278);
    Cavs::~Cavs(&local_248);
    Write<int>::~Write(&local_338);
  }
  return;
}

Assistant:

void transfer_densities_and_conserve_coarsen(Mesh* old_mesh,
    TransferOpts const& opts, Mesh* new_mesh, LOs keys2verts, Adj keys2doms,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!has_densities_or_conserved(old_mesh, opts)) return;
  auto keys2prods = keys2doms.a2ab;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  auto bdry_keys2doms = keys2doms;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  auto dim = old_mesh->dim();
  for (Int i = 0; i < old_mesh->ntags(dim); ++i) {
    auto tagbase = old_mesh->get_tag(dim, i);
    if (should_conserve(old_mesh, opts, dim, tagbase) ||
        is_density(old_mesh, opts, dim, tagbase)) {
      auto ncomps = tagbase->ncomps();
      auto new_elem_densities_w = Write<Real>(new_mesh->nelems() * ncomps);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[NOT_BDRY][NO_COLOR][0], new_elem_densities_w);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[TOUCH_BDRY][NO_COLOR][0], new_elem_densities_w);
      for (auto color_cavs : cavs[KEY_BDRY][CLASS_COLOR]) {
        transfer_by_intersection(
            old_mesh, new_mesh, tagbase, color_cavs, new_elem_densities_w);
      }
      transfer_common2(old_mesh, new_mesh, dim, same_ents2old_ents,
          same_ents2new_ents, tagbase, new_elem_densities_w);
    }
  }
  if (!should_conserve_any(old_mesh, opts)) return;
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}